

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O2

PClass * __thiscall AKey::StaticType(AKey *this)

{
  return RegistrationInfo.MyClass;
}

Assistant:

bool AKey::HandlePickup (AInventory *item)
{
	// In single player, you can pick up an infinite number of keys
	// even though you can only hold one of each.
	if (multiplayer)
	{
		return Super::HandlePickup (item);
	}
	if (GetClass() == item->GetClass())
	{
		item->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	if (Inventory != NULL)
	{
		return Inventory->HandlePickup (item);
	}
	return false;
}